

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void Fl::add_fd(int n,int events,_func_void_int_void_ptr *cb,void *v)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  FD *pFVar5;
  size_t __size;
  long lVar6;
  
  remove_fd(n,events);
  lVar6 = (long)nfds;
  iVar4 = nfds + 1;
  bVar2 = fd_array_size <= nfds;
  nfds = iVar4;
  pFVar5 = fd;
  if (bVar2) {
    lVar1 = (long)fd_array_size * 2 + 1;
    fd_array_size = (int)lVar1;
    __size = lVar1 * 0x18;
    if (fd == (FD *)0x0) {
      pFVar5 = (FD *)malloc(__size);
    }
    else {
      pFVar5 = (FD *)realloc(fd,__size);
    }
    if (pFVar5 == (FD *)0x0) {
      return;
    }
  }
  fd = pFVar5;
  pFVar5 = fd;
  fd[lVar6].cb = cb;
  pFVar5[lVar6].arg = v;
  pFVar5[lVar6].fd = n;
  pFVar5[lVar6].events = (short)events;
  bVar3 = (byte)n;
  if ((events & 1U) != 0) {
    fdsets[0].fds_bits[n / 0x40] = fdsets[0].fds_bits[n / 0x40] | 1L << (bVar3 & 0x3f);
  }
  if ((events & 4U) != 0) {
    fdsets[1].fds_bits[n / 0x40] = fdsets[1].fds_bits[n / 0x40] | 1L << (bVar3 & 0x3f);
  }
  if ((events & 8U) != 0) {
    fdsets[2].fds_bits[n / 0x40] = fdsets[2].fds_bits[n / 0x40] | 1L << (bVar3 & 0x3f);
  }
  if (maxfd < n) {
    maxfd = n;
  }
  return;
}

Assistant:

void Fl::add_fd(int n, int events, void (*cb)(int, void*), void *v) {
  remove_fd(n,events);
  int i = nfds++;
  if (i >= fd_array_size) {
    FD *temp;
    fd_array_size = 2*fd_array_size+1;

    if (!fd) temp = (FD*)malloc(fd_array_size*sizeof(FD));
    else temp = (FD*)realloc(fd, fd_array_size*sizeof(FD));

    if (!temp) return;
    fd = temp;

#  if USE_POLL
    pollfd *tpoll;

    if (!pollfds) tpoll = (pollfd*)malloc(fd_array_size*sizeof(pollfd));
    else tpoll = (pollfd*)realloc(pollfds, fd_array_size*sizeof(pollfd));

    if (!tpoll) return;
    pollfds = tpoll;
#  endif
  }
  fd[i].cb = cb;
  fd[i].arg = v;
#  if USE_POLL
  pollfds[i].fd = n;
  pollfds[i].events = events;
#  else
  fd[i].fd = n;
  fd[i].events = events;
  if (events & POLLIN) FD_SET(n, &fdsets[0]);
  if (events & POLLOUT) FD_SET(n, &fdsets[1]);
  if (events & POLLERR) FD_SET(n, &fdsets[2]);
  if (n > maxfd) maxfd = n;
#  endif
}